

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void Prn_gen<Blob<256>>(int nbRn,pfHash hash,vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes)

{
  undefined1 auVar1 [16];
  Blob<256> h;
  value_type local_68;
  uint8_t local_48 [32];
  
  printf("Generating %i random numbers : \n",(ulong)(uint)nbRn);
  auVar1 = ZEXT816(0) << 0x40;
  local_48 = (uint8_t  [32])ZEXT1632(auVar1);
  if (0 < nbRn) {
    do {
      local_68.bytes = (uint8_t  [32])ZEXT1632(auVar1);
      (*hash)(local_48,0x20,0,&local_68);
      std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back(hashes,&local_68);
      local_48[0] = local_68.bytes[0];
      local_48[1] = local_68.bytes[1];
      local_48[2] = local_68.bytes[2];
      local_48[3] = local_68.bytes[3];
      local_48[4] = local_68.bytes[4];
      local_48[5] = local_68.bytes[5];
      local_48[6] = local_68.bytes[6];
      local_48[7] = local_68.bytes[7];
      local_48[8] = local_68.bytes[8];
      local_48[9] = local_68.bytes[9];
      local_48[10] = local_68.bytes[10];
      local_48[0xb] = local_68.bytes[0xb];
      local_48[0xc] = local_68.bytes[0xc];
      local_48[0xd] = local_68.bytes[0xd];
      local_48[0xe] = local_68.bytes[0xe];
      local_48[0xf] = local_68.bytes[0xf];
      local_48[0x10] = local_68.bytes[0x10];
      local_48[0x11] = local_68.bytes[0x11];
      local_48[0x12] = local_68.bytes[0x12];
      local_48[0x13] = local_68.bytes[0x13];
      local_48[0x14] = local_68.bytes[0x14];
      local_48[0x15] = local_68.bytes[0x15];
      local_48[0x16] = local_68.bytes[0x16];
      local_48[0x17] = local_68.bytes[0x17];
      local_48[0x18] = local_68.bytes[0x18];
      local_48[0x19] = local_68.bytes[0x19];
      local_48[0x1a] = local_68.bytes[0x1a];
      local_48[0x1b] = local_68.bytes[0x1b];
      local_48[0x1c] = local_68.bytes[0x1c];
      local_48[0x1d] = local_68.bytes[0x1d];
      local_48[0x1e] = local_68.bytes[0x1e];
      local_48[0x1f] = local_68.bytes[0x1f];
      auVar1 = ZEXT816(0) << 0x20;
      nbRn = nbRn + -1;
    } while (nbRn != 0);
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}